

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialJointPolicyPureVector.cpp
# Opt level: O0

PartialJointPolicyPureVector * __thiscall
PartialJointPolicyPureVector::operator=
          (PartialJointPolicyPureVector *this,PartialJointPolicyDiscretePure *o)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  PartialJointPolicyPureVector *in_RSI;
  PartialJointPolicyPureVector *in_RDI;
  PartialJointPolicyPureVector *p;
  PartialJointPolicyPureVector *local_8;
  
  local_8 = in_RDI;
  if (in_RDI != in_RSI) {
    lVar2 = __dynamic_cast(in_RSI,&PartialJointPolicyDiscretePure::typeinfo,&typeinfo,0);
    if (lVar2 == 0) {
      __cxa_bad_cast();
    }
    iVar1 = (*(in_RDI->super_PartialJointPolicyDiscretePure).super_JointPolicyDiscretePure.
              super_JointPolicyDiscrete.super_JointPolicy._vptr_JointPolicy[0x17])(in_RDI,lVar2);
    local_8 = (PartialJointPolicyPureVector *)CONCAT44(extraout_var,iVar1);
  }
  return local_8;
}

Assistant:

PartialJointPolicyPureVector& PartialJointPolicyPureVector::operator= (const 
        PartialJointPolicyDiscretePure& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "PartialJointPolicyPureVector& PartialJointPolicyPureVector::operator= (const PartialJointPolicyDiscretePure& o) called"<<endl;
#endif

    if (this == &o) return *this;   // Gracefully handle self assignment
    const PartialJointPolicyPureVector& p = 
        dynamic_cast<const PartialJointPolicyPureVector&>( o );
    return operator=(p);

}